

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  ImGuiID id;
  bool bVar4;
  bool bVar5;
  ImU32 fill_col;
  ImGuiCol idx;
  float fVar6;
  float fVar7;
  bool hovered;
  bool held;
  ImVec2 label_size;
  ImRect bb;
  ImVec2 size;
  bool local_7a;
  bool local_79;
  ImVec2 local_78;
  ImGuiID local_6c;
  ImRect local_68;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_6c = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_78 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_68.Min.x = (this->DC).CursorPos.x;
    fVar6 = (this->DC).CursorPos.y;
    local_58 = ZEXT416((uint)fVar6);
    if ((short)flags < 0) {
      fVar7 = (pIVar3->Style).FramePadding.y;
      fVar1 = (this->DC).CurrLineTextBaseOffset;
      if (fVar7 < fVar1) {
        local_58 = ZEXT416((uint)(fVar6 + (fVar1 - fVar7)));
      }
    }
    fVar6 = (pIVar3->Style).FramePadding.x;
    fVar7 = (pIVar3->Style).FramePadding.y;
    local_38 = CalcItemSize(*size_arg,fVar6 + fVar6 + local_78.x,fVar7 + fVar7 + local_78.y);
    local_68.Max.x = local_68.Min.x + local_38.x;
    local_68.Max.y = (float)local_58._0_4_ + local_38.y;
    local_68.Min.y = (float)local_58._0_4_;
    ItemSize(&local_38,(pIVar3->Style).FramePadding.y);
    id = local_6c;
    bVar5 = false;
    bVar4 = ItemAdd(&local_68,local_6c,(ImRect *)0x0,0);
    if (bVar4) {
      bVar5 = ButtonBehavior(&local_68,id,&local_7a,&local_79,
                             ((pIVar3->LastItemData).InFlags & 2U) << 9 | flags);
      if ((local_79 != true) || (idx = 0x17, local_7a == false)) {
        idx = local_7a + 0x15;
      }
      fill_col = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_68,id,1);
      IVar2.y = local_68.Min.y;
      IVar2.x = local_68.Min.x;
      RenderFrame(IVar2,local_68.Max,fill_col,true,(pIVar3->Style).FrameRounding);
      if (pIVar3->LogEnabled == true) {
        LogSetNextTextDecoration("[","]");
      }
      IVar2 = (pIVar3->Style).FramePadding;
      fVar6 = IVar2.x;
      local_40.x = local_68.Min.x + fVar6;
      fVar7 = IVar2.y;
      local_40.y = local_68.Min.y + fVar7;
      local_48.x = local_68.Max.x - fVar6;
      local_48.y = local_68.Max.y - fVar7;
      RenderTextClipped(&local_40,&local_48,label,(char *)0x0,&local_78,
                        &(pIVar3->Style).ButtonTextAlign,&local_68);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}